

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

void __thiscall QDialog::setSizeGripEnabled(QDialog *this,bool enabled)

{
  long lVar1;
  long *plVar2;
  QWidgetData *pQVar3;
  QWidgetData *pQVar4;
  LayoutDirection LVar5;
  QWidget *pQVar6;
  int __sig;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QSize local_28;
  long local_20;
  
  __sig = (int)&local_28;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(bool *)(lVar1 + 0x2a0) = enabled;
  if ((((int)CONCAT71(in_register_00000031,enabled) == 0) || (*(char *)(lVar1 + 0x278) == '\0')) &&
     (plVar2 = *(long **)(lVar1 + 0x298), (plVar2 == (long *)0x0) == enabled)) {
    if (enabled) {
      pQVar6 = (QWidget *)operator_new(0x28);
      QSizeGrip::QSizeGrip((QSizeGrip *)pQVar6,&this->super_QWidget);
      *(QWidget **)(lVar1 + 0x298) = pQVar6;
      local_28 = (QSize)(**(code **)(*(long *)pQVar6 + 0x70))(pQVar6);
      QWidget::resize(pQVar6,&local_28);
      LVar5 = QWidget::layoutDirection(&this->super_QWidget);
      pQVar6 = *(QWidget **)(lVar1 + 0x298);
      if (LVar5 == RightToLeft) {
        pQVar3 = (this->super_QWidget).data;
        local_28 = (QSize)((ulong)(uint)(((pQVar3->crect).y2.m_i -
                                         ((pQVar3->crect).y1.m_i + (pQVar6->data->crect).y2.m_i)) +
                                        (pQVar6->data->crect).y1.m_i) << 0x20);
      }
      else {
        pQVar3 = (this->super_QWidget).data;
        pQVar4 = pQVar6->data;
        local_28.wd.m_i =
             ((pQVar3->crect).x2.m_i - ((pQVar3->crect).x1.m_i + (pQVar4->crect).x2.m_i)) +
             (pQVar4->crect).x1.m_i;
        local_28.ht.m_i =
             ((pQVar3->crect).y2.m_i - ((pQVar3->crect).y1.m_i + (pQVar4->crect).y2.m_i)) +
             (pQVar4->crect).y1.m_i;
      }
      QWidget::move(pQVar6,(QPoint *)&local_28);
      QWidget::raise(*(QWidget **)(lVar1 + 0x298),__sig);
      QWidget::show(*(QWidget **)(lVar1 + 0x298));
    }
    else {
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x20))();
      }
      *(undefined8 *)(lVar1 + 0x298) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::setSizeGripEnabled(bool enabled)
{
#if !QT_CONFIG(sizegrip)
    Q_UNUSED(enabled);
#else
    Q_D(QDialog);
#if QT_CONFIG(sizegrip)
    d->sizeGripEnabled = enabled;
    if (enabled && d->doShowExtension)
        return;
#endif
    if (!enabled != !d->resizer) {
        if (enabled) {
            d->resizer = new QSizeGrip(this);
            // adjustSize() processes all events, which is suboptimal
            d->resizer->resize(d->resizer->sizeHint());
            if (isRightToLeft())
                d->resizer->move(rect().bottomLeft() -d->resizer->rect().bottomLeft());
            else
                d->resizer->move(rect().bottomRight() -d->resizer->rect().bottomRight());
            d->resizer->raise();
            d->resizer->show();
        } else {
            delete d->resizer;
            d->resizer = nullptr;
        }
    }
#endif // QT_CONFIG(sizegrip)
}